

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

ggml_tensor * __thiscall
llm_build_rwkv6_base::build_rwkv6_time_mix
          (llm_build_rwkv6_base *this,ggml_cgraph *gf,ggml_tensor *cur,ggml_tensor *x_prev,
          ggml_tensor *state_copy,ggml_tensor *state_mask,llama_ubatch *ubatch,int il)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t n_seqs;
  uint uVar3;
  uint uVar4;
  int iVar5;
  llama_hparams *this_00;
  llama_memory_i *plVar6;
  pointer plVar7;
  ggml_context *pgVar8;
  _func_int *p_Var9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  ggml_tensor *pgVar18;
  undefined8 uVar19;
  ggml_tensor *pgVar20;
  ggml_tensor *pgVar21;
  ggml_tensor *pgVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  ggml_tensor *pgVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  double dVar29;
  ggml_tensor *local_e0;
  ggml_tensor *local_c8;
  ggml_tensor *local_a0;
  undefined8 local_80;
  
  this_00 = (this->super_llm_graph_context).hparams;
  plVar6 = (this->super_llm_graph_context).memory;
  uVar1 = ubatch->n_tokens;
  uVar2 = ubatch->n_seq_tokens;
  n_seqs = ubatch->n_seqs;
  uVar3 = this_00->n_embd;
  uVar28 = (ulong)uVar3;
  uVar4 = this_00->wkv_head_size;
  uVar10 = uVar3 / uVar4;
  uVar11 = llama_hparams::n_head_kv(this_00,il);
  iVar5 = *(int *)&plVar6[0xd]._vptr_llama_memory_i;
  lVar26 = (long)il;
  plVar7 = (this->model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pgVar25 = plVar7[lVar26].time_mix_first;
  uVar13 = ggml_sub((this->super_llm_graph_context).ctx0,x_prev,cur);
  uVar13 = ggml_reshape_2d((this->super_llm_graph_context).ctx0,uVar13,uVar28,uVar1);
  uVar14 = ggml_reshape_2d((this->super_llm_graph_context).ctx0,cur,uVar28,uVar1);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  uVar15 = ggml_mul(pgVar8,uVar13,plVar7[lVar26].time_mix_lerp_x);
  uVar15 = ggml_add(pgVar8,uVar15,uVar14);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  uVar15 = ggml_mul_mat(pgVar8,plVar7[lVar26].time_mix_w1,uVar15);
  uVar15 = ggml_tanh(pgVar8,uVar15);
  uVar15 = ggml_reshape_4d(pgVar8,uVar15,(plVar7[lVar26].time_mix_w1)->ne[1] / 5,1,5,uVar1);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  uVar15 = ggml_permute(pgVar8,uVar15,0,1,3,2);
  uVar15 = ggml_cont(pgVar8,uVar15);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  pgVar18 = plVar7[lVar26].time_mix_w2;
  uVar16 = ggml_reshape_4d(pgVar8,pgVar18,pgVar18->ne[0],pgVar18->ne[1],1,5);
  lVar17 = ggml_mul_mat(pgVar8,uVar16,uVar15);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  if (plVar7[lVar26].time_mix_lerp_fused == (ggml_tensor *)0x0) {
    uVar15 = ggml_view_2d(pgVar8,lVar17,uVar28,uVar1,*(undefined8 *)(lVar17 + 0x38),0);
    uVar27 = uVar3 * uVar1;
    uVar16 = ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                          *(undefined8 *)(lVar17 + 0x38),(ulong)uVar27 * 4);
    uVar23 = ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                          *(undefined8 *)(lVar17 + 0x38),(ulong)(uVar27 * 2) << 2);
    uVar24 = ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                          *(undefined8 *)(lVar17 + 0x38),(ulong)(uVar27 * 3) << 2);
    uVar19 = ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                          *(undefined8 *)(lVar17 + 0x38),(ulong)(uVar27 * 4) << 2);
    pgVar8 = (this->super_llm_graph_context).ctx0;
    uVar15 = ggml_add(pgVar8,uVar15,plVar7[lVar26].time_mix_lerp_w);
    uVar15 = ggml_mul(pgVar8,uVar15,uVar13);
    local_80 = ggml_add(pgVar8,uVar15,uVar14);
    pgVar8 = (this->super_llm_graph_context).ctx0;
    uVar15 = ggml_add(pgVar8,uVar16,plVar7[lVar26].time_mix_lerp_k);
    uVar15 = ggml_mul(pgVar8,uVar15,uVar13);
    local_e0 = (ggml_tensor *)ggml_add(pgVar8,uVar15,uVar14);
    pgVar8 = (this->super_llm_graph_context).ctx0;
    uVar15 = ggml_add(pgVar8,uVar23,plVar7[lVar26].time_mix_lerp_v);
    uVar15 = ggml_mul(pgVar8,uVar15,uVar13);
    local_a0 = (ggml_tensor *)ggml_add(pgVar8,uVar15,uVar14);
    pgVar8 = (this->super_llm_graph_context).ctx0;
    uVar15 = ggml_add(pgVar8,uVar24,plVar7[lVar26].time_mix_lerp_r);
    uVar15 = ggml_mul(pgVar8,uVar15,uVar13);
    pgVar18 = (ggml_tensor *)ggml_add(pgVar8,uVar15,uVar14);
    pgVar8 = (this->super_llm_graph_context).ctx0;
    uVar15 = ggml_add(pgVar8,uVar19,plVar7[lVar26].time_mix_lerp_g);
    uVar13 = ggml_mul(pgVar8,uVar15,uVar13);
    local_c8 = (ggml_tensor *)ggml_add(pgVar8,uVar13,uVar14);
  }
  else {
    uVar13 = ggml_reshape_3d(pgVar8,uVar13,uVar28,1,uVar1);
    uVar14 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar14,uVar28,1,uVar1);
    pgVar8 = (this->super_llm_graph_context).ctx0;
    uVar15 = ggml_add(pgVar8,lVar17,plVar7[lVar26].time_mix_lerp_fused);
    uVar13 = ggml_mul(pgVar8,uVar15,uVar13);
    lVar17 = ggml_add(pgVar8,uVar13,uVar14);
    local_80 = ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                            *(undefined8 *)(lVar17 + 0x38),0);
    uVar27 = uVar3 * uVar1;
    local_e0 = (ggml_tensor *)
               ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                            *(undefined8 *)(lVar17 + 0x38),(ulong)uVar27 * 4);
    local_a0 = (ggml_tensor *)
               ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                            *(undefined8 *)(lVar17 + 0x38),(ulong)(uVar27 * 2) << 2);
    pgVar18 = (ggml_tensor *)
              ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                           *(undefined8 *)(lVar17 + 0x38),(ulong)(uVar27 * 3) << 2);
    local_c8 = (ggml_tensor *)
               ggml_view_2d((this->super_llm_graph_context).ctx0,lVar17,uVar28,uVar1,
                            *(undefined8 *)(lVar17 + 0x38),(ulong)(uVar27 * 4) << 2);
  }
  pgVar18 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar7[lVar26].time_mix_receptance,pgVar18);
  pgVar20 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar7[lVar26].time_mix_key,local_e0);
  pgVar21 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar7[lVar26].time_mix_value,local_a0);
  if (plVar7[lVar26].time_mix_receptance_b != (ggml_tensor *)0x0) {
    pgVar18 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar18);
  }
  if (plVar7[lVar26].time_mix_key_b != (ggml_tensor *)0x0) {
    pgVar20 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar20);
  }
  if (plVar7[lVar26].time_mix_value_b != (ggml_tensor *)0x0) {
    pgVar21 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar21);
  }
  pgVar22 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar7[lVar26].time_mix_gate,local_c8);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  if (pgVar25 == (ggml_tensor *)0x0) {
    uVar13 = ggml_sigmoid(pgVar8,pgVar22);
  }
  else {
    uVar13 = ggml_silu(pgVar8,pgVar22);
  }
  if (uVar11 != uVar10 && uVar11 != 0) {
    if (uVar10 % uVar11 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
                 ,0x2cee,"GGML_ASSERT(%s) failed","n_head % n_head_kv == 0");
    }
    uVar14 = ggml_reshape_4d((this->super_llm_graph_context).ctx0,pgVar20,uVar4,1,uVar11,uVar1);
    uVar15 = ggml_reshape_4d((this->super_llm_graph_context).ctx0,pgVar21,uVar4,1,uVar11,uVar1);
    uVar16 = ggml_new_tensor_4d((this->super_llm_graph_context).ctx0,0,uVar4,uVar10 / uVar11,uVar11,
                                uVar1);
    pgVar20 = (ggml_tensor *)ggml_repeat((this->super_llm_graph_context).ctx0,uVar14,uVar16);
    pgVar21 = (ggml_tensor *)ggml_repeat((this->super_llm_graph_context).ctx0,uVar15,uVar16);
  }
  uVar23 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar20,uVar4,uVar10,uVar1);
  uVar14 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar21,uVar4,uVar10,uVar1);
  uVar15 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar18,uVar4,uVar10,uVar1);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  pgVar18 = plVar7[lVar26].time_mix_decay_w2;
  uVar16 = ggml_mul_mat(pgVar8,plVar7[lVar26].time_mix_decay_w1,local_80);
  uVar16 = ggml_tanh(pgVar8,uVar16);
  uVar16 = ggml_mul_mat(pgVar8,pgVar18,uVar16);
  uVar16 = ggml_add((this->super_llm_graph_context).ctx0,uVar16,plVar7[lVar26].time_mix_decay);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  uVar16 = ggml_exp(pgVar8,uVar16);
  uVar16 = ggml_neg(pgVar8,uVar16);
  uVar16 = ggml_exp(pgVar8,uVar16);
  uVar16 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar16,uVar4,uVar10,uVar1);
  if (pgVar25 == (ggml_tensor *)0x0) {
    pgVar8 = (this->super_llm_graph_context).ctx0;
    uVar24 = ggml_mul(pgVar8,uVar23,uVar16);
    uVar23 = ggml_sub(pgVar8,uVar23,uVar24);
  }
  pgVar18 = (ggml_tensor *)plVar6[0x15]._vptr_llama_memory_i[lVar26];
  uVar11 = llama_hparams::n_embd_v_s((this->super_llm_graph_context).hparams);
  pgVar18 = llm_graph_context::build_copy_mask_state
                      (&this->super_llm_graph_context,gf,pgVar18,state_copy,state_mask,uVar11,n_seqs
                      );
  pgVar8 = (this->super_llm_graph_context).ctx0;
  if (pgVar25 == (ggml_tensor *)0x0) {
    dVar29 = pow((double)uVar4,-0.5);
    uVar14 = ggml_gated_linear_attn((float)dVar29,pgVar8,uVar23,uVar14,uVar15,uVar16,pgVar18);
  }
  else {
    uVar14 = ggml_rwkv_wkv6(pgVar8,uVar23,uVar14,uVar15,plVar7[lVar26].time_mix_first,uVar16,pgVar18
                           );
  }
  uVar15 = ggml_view_1d((this->super_llm_graph_context).ctx0,uVar14,(ulong)(uVar1 * uVar3),0);
  uVar14 = ggml_view_1d((this->super_llm_graph_context).ctx0,uVar14,uVar3 * n_seqs * uVar4,
                        (ulong)(uVar1 * uVar3) << 2);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  p_Var9 = plVar6[0x15]._vptr_llama_memory_i[lVar26];
  uVar11 = llama_hparams::n_embd_v_s((this->super_llm_graph_context).hparams);
  uVar12 = llama_hparams::n_embd_v_s((this->super_llm_graph_context).hparams);
  lVar17 = ggml_element_size(plVar6[0x15]._vptr_llama_memory_i[lVar26]);
  uVar16 = ggml_view_1d(pgVar8,p_Var9,n_seqs * uVar11,(ulong)(iVar5 * uVar12) * lVar17);
  uVar14 = ggml_cpy(pgVar8,uVar14,uVar16);
  ggml_build_forward_expand(gf,uVar14);
  pgVar8 = (this->super_llm_graph_context).ctx0;
  if (pgVar25 == (ggml_tensor *)0x0) {
    uVar14 = ggml_reshape_2d(pgVar8,uVar15,uVar28,uVar1);
  }
  else {
    uVar14 = ggml_reshape_3d(pgVar8,uVar15,uVar28 / uVar10,uVar10,uVar1);
    uVar14 = ggml_norm(0x3a27c5ac,(this->super_llm_graph_context).ctx0,uVar14);
    uVar14 = ggml_reshape_2d((this->super_llm_graph_context).ctx0,uVar14,uVar28,uVar1);
    pgVar8 = (this->super_llm_graph_context).ctx0;
    uVar14 = ggml_mul(pgVar8,uVar14,plVar7[lVar26].time_mix_ln);
    uVar14 = ggml_add(pgVar8,uVar14,plVar7[lVar26].time_mix_ln_b);
  }
  pgVar25 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,uVar14,uVar13);
  pgVar25 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar7[lVar26].time_mix_output,pgVar25);
  pgVar25 = (ggml_tensor *)
            ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar25,uVar28,uVar2,n_seqs);
  return pgVar25;
}

Assistant:

ggml_tensor * build_rwkv6_time_mix(
            ggml_cgraph * gf,
            ggml_tensor * cur,
            ggml_tensor * x_prev,
            ggml_tensor * state_copy,
            ggml_tensor * state_mask,
            const llama_ubatch & ubatch,
            int   il) const {
        const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

        const auto n_tokens = ubatch.n_tokens;
        const auto n_seqs = ubatch.n_seqs;
        const auto n_seq_tokens = ubatch.n_seq_tokens;
        const auto n_embd = hparams.n_embd;
        const auto head_size = hparams.wkv_head_size;
        const auto n_head = n_embd / head_size;
        const auto n_head_kv = hparams.n_head_kv(il);

        const auto kv_head = kv_self->head;

        const auto & layer = model.layers[il];

        bool is_qrwkv = layer.time_mix_first == nullptr;

        ggml_tensor * sx = ggml_sub(ctx0, x_prev, cur);

        sx  = ggml_reshape_2d(ctx0, sx,  n_embd, n_tokens);
        cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);

        ggml_tensor * xxx = ggml_add(ctx0, ggml_mul(ctx0, sx, layer.time_mix_lerp_x), cur);

        xxx = ggml_reshape_4d(
                ctx0,
                ggml_tanh(
                    ctx0,
                    ggml_mul_mat(ctx0, layer.time_mix_w1, xxx)
                    ),
                layer.time_mix_w1->ne[1] / 5, 1, 5, n_tokens
                );

        xxx = ggml_cont(ctx0, ggml_permute(ctx0, xxx, 0, 1, 3, 2));

        xxx = ggml_mul_mat(
                ctx0,
                ggml_reshape_4d(
                    ctx0,
                    layer.time_mix_w2,
                    layer.time_mix_w2->ne[0], layer.time_mix_w2->ne[1], 1, 5
                    ),
                xxx
                );

        ggml_tensor *xw, *xk, *xv, *xr, *xg;
        if (layer.time_mix_lerp_fused) {
            // fusing these weights makes some performance improvement
            sx  = ggml_reshape_3d(ctx0, sx,  n_embd, 1, n_tokens);
            cur = ggml_reshape_3d(ctx0, cur, n_embd, 1, n_tokens);
            xxx = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xxx, layer.time_mix_lerp_fused), sx), cur);
            xw = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], 0);
            xk = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * sizeof(float));
            xv = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 2 * sizeof(float));
            xr = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 3 * sizeof(float));
            xg = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 4 * sizeof(float));
        } else {
            // for backward compatibility
            xw = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], 0);
            xk = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * sizeof(float));
            xv = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 2 * sizeof(float));
            xr = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 3 * sizeof(float));
            xg = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 4 * sizeof(float));

            xw = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xw, layer.time_mix_lerp_w), sx), cur);
            xk = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xk, layer.time_mix_lerp_k), sx), cur);
            xv = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xv, layer.time_mix_lerp_v), sx), cur);
            xr = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xr, layer.time_mix_lerp_r), sx), cur);
            xg = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xg, layer.time_mix_lerp_g), sx), cur);
        }

        ggml_tensor * r = build_lora_mm(layer.time_mix_receptance, xr);
        ggml_tensor * k = build_lora_mm(layer.time_mix_key,        xk);
        ggml_tensor * v = build_lora_mm(layer.time_mix_value,      xv);
        if (layer.time_mix_receptance_b) {
            r = ggml_add(ctx0, r, layer.time_mix_receptance_b);
        }
        if (layer.time_mix_key_b) {
            k = ggml_add(ctx0, k, layer.time_mix_key_b);
        }
        if (layer.time_mix_value_b) {
            v = ggml_add(ctx0, v, layer.time_mix_value_b);
        }

        ggml_tensor * g = build_lora_mm(layer.time_mix_gate, xg);
        if (is_qrwkv) {
            g = ggml_sigmoid(ctx0, g);
        } else {
            g = ggml_silu(ctx0, g);
        }

        if (n_head_kv != 0 && n_head_kv != n_head) {
            GGML_ASSERT(n_head % n_head_kv == 0);
            k = ggml_reshape_4d(ctx0, k, head_size, 1, n_head_kv, n_tokens);
            v = ggml_reshape_4d(ctx0, v, head_size, 1, n_head_kv, n_tokens);
            ggml_tensor * tmp = ggml_new_tensor_4d(ctx0, GGML_TYPE_F32, head_size, n_head / n_head_kv, n_head_kv, n_tokens);
            k = ggml_repeat(ctx0, k, tmp);
            v = ggml_repeat(ctx0, v, tmp);
        }

        k = ggml_reshape_3d(ctx0, k, head_size, n_head, n_tokens);
        v = ggml_reshape_3d(ctx0, v, head_size, n_head, n_tokens);
        r = ggml_reshape_3d(ctx0, r, head_size, n_head, n_tokens);

        ggml_tensor * w = ggml_mul_mat(
                ctx0,
                layer.time_mix_decay_w2,
                ggml_tanh(
                    ctx0,
                    ggml_mul_mat(ctx0, layer.time_mix_decay_w1, xw)
                    )
                );

        w = ggml_add(ctx0, w, layer.time_mix_decay);
        w = ggml_exp(ctx0, ggml_neg(ctx0, ggml_exp(ctx0, w)));
        w = ggml_reshape_3d(ctx0, w, head_size, n_head, n_tokens);

        if (is_qrwkv) {
            // k = k * (1 - w)
            k = ggml_sub(ctx0, k, ggml_mul(ctx0, k, w));
        }

        ggml_tensor * wkv_state = build_copy_mask_state(
                gf, kv_self->v_l[il], state_copy, state_mask,
                hparams.n_embd_v_s(), n_seqs);

        ggml_tensor * wkv_output;
        if (is_qrwkv) {
            wkv_output = ggml_gated_linear_attn(ctx0, k, v, r, w, wkv_state, pow(head_size, -0.5f));
        } else {
            wkv_output = ggml_rwkv_wkv6(ctx0, k, v, r, layer.time_mix_first, w, wkv_state);
        }
        cur = ggml_view_1d(ctx0, wkv_output, n_embd * n_tokens, 0);
        wkv_state = ggml_view_1d(ctx0, wkv_output, n_embd * head_size * n_seqs, n_embd * n_tokens * sizeof(float));

        ggml_build_forward_expand(
                gf,
                ggml_cpy(
                    ctx0,
                    wkv_state,
                    ggml_view_1d(
                        ctx0,
                        kv_self->v_l[il],
                        hparams.n_embd_v_s() * n_seqs,
                        hparams.n_embd_v_s() * kv_head * ggml_element_size(kv_self->v_l[il])
                        )
                    )
                );

        if (!is_qrwkv) {
            // group norm with head_count groups
            cur = ggml_reshape_3d(ctx0, cur, n_embd / n_head, n_head, n_tokens);
            cur = ggml_norm(ctx0, cur, 64e-5f);

            // Convert back to regular vectors.
            cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);
            cur = ggml_add(ctx0, ggml_mul(ctx0, cur, layer.time_mix_ln), layer.time_mix_ln_b);
        } else {
            cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);
        }

        cur = ggml_mul(ctx0, cur, g);
        cur = build_lora_mm(layer.time_mix_output, cur);

        return ggml_reshape_3d(ctx0, cur, n_embd, n_seq_tokens, n_seqs);
    }